

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool tinygltf::ParseAudioSource
               (AudioSource *source,string *err,json *o,
               bool store_original_json_for_extras_and_extensions)

{
  json *pjVar1;
  json *pjVar2;
  string *psVar3;
  ulong uVar4;
  string local_160 [39];
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [32];
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [32];
  string local_80 [55];
  allocator local_49;
  string local_48 [39];
  byte local_21;
  json *pjStack_20;
  bool store_original_json_for_extras_and_extensions_local;
  json *o_local;
  string *err_local;
  AudioSource *source_local;
  
  local_21 = store_original_json_for_extras_and_extensions;
  pjStack_20 = o;
  o_local = (json *)err;
  err_local = &source->name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"name",&local_49);
  std::__cxx11::string::string(local_80);
  ParseStringProperty(&source->name,err,o,(string *)local_48,false,(string *)local_80);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  pjVar2 = o_local;
  pjVar1 = pjStack_20;
  psVar3 = err_local + 0x20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"uri",&local_a1);
  std::__cxx11::string::string(local_c8);
  ParseStringProperty(psVar3,(string *)pjVar2,pjVar1,(string *)local_a0,false,(string *)local_c8);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  uVar4 = std::__cxx11::string::empty();
  pjVar2 = o_local;
  pjVar1 = pjStack_20;
  if ((uVar4 & 1) != 0) {
    psVar3 = err_local + 0x40;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"bufferView",&local_e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"",&local_111);
    ParseIntegerProperty
              ((int *)psVar3,(string *)pjVar2,pjVar1,(string *)local_e8,true,(string *)local_110);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    pjVar2 = o_local;
    pjVar1 = pjStack_20;
    psVar3 = err_local + 0x48;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"mimeType",&local_139);
    std::__cxx11::string::string(local_160);
    ParseStringProperty(psVar3,(string *)pjVar2,pjVar1,(string *)local_138,true,(string *)local_160)
    ;
    std::__cxx11::string::~string(local_160);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
  }
  ParseExtrasAndExtensions<tinygltf::AudioSource>
            ((AudioSource *)err_local,(string *)o_local,pjStack_20,(bool)(local_21 & 1));
  return true;
}

Assistant:

static bool ParseAudioSource(
    AudioSource *source, std::string *err, const detail::json &o,
    bool store_original_json_for_extras_and_extensions) {
  ParseStringProperty(&source->name, err, o, "name", false);
  ParseStringProperty(&source->uri, err, o, "uri", false);

  if (source->uri.empty()) {
    ParseIntegerProperty(&source->bufferView, err, o, "bufferView", true);
    ParseStringProperty(&source->mimeType, err, o, "mimeType", true);
  }

  ParseExtrasAndExtensions(source, err, o,
                           store_original_json_for_extras_and_extensions);

  return true;
}